

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TrainManager.hpp
# Opt level: O0

int __thiscall sjtu::TrainManager::init(TrainManager *this,EVP_PKEY_CTX *ctx)

{
  _Ios_Openmode _Var1;
  BplusTree<unsigned_long_long,_unsigned_int,_100,_std::less<unsigned_long_long>_> *pBVar2;
  BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_> *pBVar3;
  FileManager<sjtu::TrainManager::stationNameType> *pFVar4;
  DynamicFileManager<sjtu::trainType> *pDVar5;
  ofstream outfile;
  undefined8 in_stack_fffffffffffffc40;
  uint cache_size;
  BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_> *pBVar6;
  undefined1 local_360 [518];
  undefined1 local_15a;
  allocator local_159;
  string local_158 [38];
  undefined1 local_132;
  allocator local_131;
  string local_130 [38];
  undefined1 local_10a;
  allocator local_109;
  string local_108 [38];
  undefined1 local_e2;
  undefined1 local_e1 [40];
  allocator local_b9;
  string local_b8 [39];
  allocator local_91;
  string local_90 [39];
  allocator local_69;
  string local_68 [55];
  allocator local_31;
  string local_30 [39];
  byte local_9;
  TrainManager *local_8;
  
  local_9 = (byte)ctx & 1;
  local_8 = this;
  if (((ulong)ctx & 1) == 0) {
    pBVar2 = (BplusTree<unsigned_long_long,_unsigned_int,_100,_std::less<unsigned_long_long>_> *)
             operator_new(0x18);
    local_e2 = 1;
    pBVar6 = (BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_> *)local_e1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)(local_e1 + 1),"StationBpTree.dat",(allocator *)pBVar6);
    BplusTree<unsigned_long_long,_unsigned_int,_100,_std::less<unsigned_long_long>_>::BplusTree
              ((BplusTree<unsigned_long_long,_unsigned_int,_100,_std::less<unsigned_long_long>_> *)
               pBVar6,(string *)pBVar2,(uint)((ulong)in_stack_fffffffffffffc40 >> 0x20));
    local_e2 = 0;
    this->StationBpTree = pBVar2;
    std::__cxx11::string::~string((string *)(local_e1 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_e1);
    pBVar3 = (BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_> *)
             operator_new(0x18);
    local_10a = 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_108,"TrainBpTree.dat",&local_109);
    cache_size = (uint)((ulong)&local_109 >> 0x20);
    BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::BplusTree
              (pBVar6,(string *)pBVar2,cache_size);
    local_10a = 0;
    this->TrainBpTree = pBVar3;
    std::__cxx11::string::~string(local_108);
    std::allocator<char>::~allocator((allocator<char> *)&local_109);
    pDVar5 = (DynamicFileManager<sjtu::trainType> *)operator_new(0x228);
    local_132 = 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_130,"TrainFile.dat",&local_131);
    DynamicFileManager<sjtu::trainType>::DynamicFileManager
              ((DynamicFileManager<sjtu::trainType> *)pBVar6,(string *)pBVar2,cache_size);
    local_132 = 0;
    this->TrainFile = pDVar5;
    std::__cxx11::string::~string(local_130);
    std::allocator<char>::~allocator((allocator<char> *)&local_131);
    pFVar4 = (FileManager<sjtu::TrainManager::stationNameType> *)operator_new(0x228);
    local_15a = 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_158,"StationFile.dat",&local_159);
    FileManager<sjtu::TrainManager::stationNameType>::FileManager
              ((FileManager<sjtu::TrainManager::stationNameType> *)pBVar6,(string *)pBVar2,
               cache_size);
    local_15a = 0;
    this->StationFile = pFVar4;
    std::__cxx11::string::~string(local_158);
    std::allocator<char>::~allocator((allocator<char> *)&local_159);
  }
  else {
    pBVar2 = this->StationBpTree;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_30,"StationBpTree.dat",&local_31);
    BplusTree<unsigned_long_long,_unsigned_int,_100,_std::less<unsigned_long_long>_>::init
              (pBVar2,(EVP_PKEY_CTX *)local_30);
    std::__cxx11::string::~string(local_30);
    std::allocator<char>::~allocator((allocator<char> *)&local_31);
    pBVar6 = this->TrainBpTree;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_68,"TrainBpTree.dat",&local_69);
    BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::init
              (pBVar6,(EVP_PKEY_CTX *)local_68);
    std::__cxx11::string::~string(local_68);
    std::allocator<char>::~allocator((allocator<char> *)&local_69);
    pDVar5 = this->TrainFile;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_90,"TrainFile.dat",&local_91);
    (**(pDVar5->super_FileManager_Base<sjtu::trainType>)._vptr_FileManager_Base)
              (pDVar5,local_90,0x10,1);
    std::__cxx11::string::~string(local_90);
    std::allocator<char>::~allocator((allocator<char> *)&local_91);
    pFVar4 = this->StationFile;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_b8,"StationFile.dat",&local_b9);
    (**(pFVar4->super_FileManager_Base<sjtu::TrainManager::stationNameType>)._vptr_FileManager_Base)
              (pFVar4,local_b8,0x20,1);
    std::__cxx11::string::~string(local_b8);
    std::allocator<char>::~allocator((allocator<char> *)&local_b9);
  }
  pDVar5 = this->TrainFile;
  if (((pDVar5->super_FileManager_Base<sjtu::trainType>).is_newfile & 1U) != 0) {
    _Var1 = std::operator|(_S_out,_S_bin);
    std::ofstream::ofstream(local_360,"Bitset.dat",_Var1);
    std::ofstream::close();
    pDVar5 = (DynamicFileManager<sjtu::trainType> *)std::ofstream::~ofstream(local_360);
  }
  return (int)pDVar5;
}

Assistant:

void init(bool is_reset = false)
		{
			if (is_reset)
			{
				StationBpTree -> init("StationBpTree.dat" , StationBpTree_cache_size , true);
				TrainBpTree -> init("TrainBpTree.dat" , TrainBpTree_cache_size , true);
				TrainFile -> init("TrainFile.dat" , TrainFile_cache_size , true);
				StationFile -> init("StationFile.dat" , StationFile_cache_size , true);
			}
			else
			{
				StationBpTree = new BplusTree<StringHasher::hashType , unsigned int> ("StationBpTree.dat" , StationBpTree_cache_size);
				TrainBpTree = new BplusTree<StringHasher::hashType , locType> ("TrainBpTree.dat" , TrainBpTree_cache_size);
				TrainFile = new DynamicFileManager<trainType> ("TrainFile.dat" , TrainFile_cache_size);
				StationFile = new FileManager<stationNameType> ("StationFile.dat" , StationFile_cache_size);
			}
			if (TrainFile -> is_newfile)
			{
				std::ofstream outfile("Bitset.dat" , std::ios_base::out | std::ios_base::binary);
				outfile.close();
			}
		}